

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O1

void __thiscall
DReachabilityPropagator::reverseDFS
          (DReachabilityPropagator *this,int u,vector<bool,_std::allocator<bool>_> *v,int skip_n)

{
  ulong *puVar1;
  uint uVar2;
  int u_00;
  pointer pvVar3;
  uint *puVar4;
  BoolView *pBVar5;
  ulong uVar6;
  ulong uVar7;
  uint *puVar8;
  
  uVar6 = (ulong)u;
  uVar7 = uVar6 + 0x3f;
  if (-1 < (long)uVar6) {
    uVar7 = uVar6;
  }
  puVar1 = (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start
           .super__Bit_iterator_base._M_p +
           ((long)uVar7 >> 6) +
           (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)u & 0x3f);
  pvVar3 = (this->in).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = *(uint **)((long)&pvVar3[uVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + 8);
  for (puVar8 = *(uint **)&pvVar3[uVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data; puVar8 != puVar4; puVar8 = puVar8 + 1) {
    uVar2 = *puVar8;
    pBVar5 = (this->super_GraphPropagator).es.data;
    if ((sat.assigns.data[(uint)pBVar5[uVar2].v] == '\0') ||
       ((uint)pBVar5[uVar2].s * 2 + -1 != (int)sat.assigns.data[(uint)pBVar5[uVar2].v])) {
      u_00 = *(this->super_GraphPropagator).endnodes.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(int)uVar2].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      ;
      uVar7 = (ulong)u_00;
      if (u_00 != skip_n) {
        uVar6 = uVar7 + 0x3f;
        if (-1 < (long)uVar7) {
          uVar6 = uVar7;
        }
        if (((v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [((long)uVar6 >> 6) +
              (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
             (uVar7 & 0x3f) & 1) == 0) {
          reverseDFS(this,u_00,v,skip_n);
        }
      }
    }
  }
  return;
}

Assistant:

void DReachabilityPropagator::reverseDFS(int u, std::vector<bool>& v, int skip_n) {
	if (DEBUG) {
		std::cout << "Reverse DFS from " << u << '\n';
	}
	v[u] = true;
	for (const int ie : in[u]) {
		if (getEdgeVar(ie).isFixed() && getEdgeVar(ie).isFalse()) {
			continue;
		}
		const int o = getTail(ie);
		if (o == skip_n || v[o]) {
			continue;
		}
		reverseDFS(o, v, skip_n);
	}
}